

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O2

bool ON_VersionNumberIsValid(uint version_number)

{
  bool bVar1;
  uint uVar2;
  uint version_day_of_month;
  uint version_month;
  uint version_year;
  uint version_branch;
  uint version_minor;
  uint version_major;
  
  uVar2 = ON_VersionNumberMinimum(1);
  if (uVar2 <= version_number) {
    version_major = 0;
    version_minor = 0;
    version_branch = 0;
    version_year = 0;
    version_month = 0;
    version_day_of_month = 0;
    bVar1 = ON_VersionNumberParse
                      (version_number,&version_major,&version_minor,&version_year,&version_month,
                       &version_day_of_month,&version_branch);
    if (bVar1) {
      uVar2 = ON_VersionNumberConstruct
                        (version_major,version_minor,version_year,version_month,version_day_of_month
                         ,version_branch);
      return uVar2 == version_number;
    }
  }
  return false;
}

Assistant:

bool ON_VersionNumberIsValid(
  unsigned int version_number
  )
{
  bool rc = ( version_number >= ON_VersionNumberMinimum(1) );
  if (rc)
  {
    unsigned int version_major = 0;
    unsigned int version_minor = 0;
    unsigned int version_branch = 0;
    unsigned int version_year = 0;
    unsigned int version_month = 0;
    unsigned int version_day_of_month = 0;
    rc = ON_VersionNumberParse(
      version_number,
      &version_major,
      &version_minor,
      &version_year,
      &version_month,
      &version_day_of_month,
      &version_branch
      );
    if (rc)
    {
      const unsigned int v = ON_VersionNumberConstruct(version_major,version_minor,version_year,version_month,version_day_of_month,version_branch);
      if ( v != version_number )
        rc = false;
    }
  }

  return rc;
}